

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O1

void __thiscall cmCPackIFWInstaller::ConfigureFromOptions(cmCPackIFWInstaller *this)

{
  string *psVar1;
  pointer pcVar2;
  cmCPackIFWGenerator *pcVar3;
  cmCPackLog *this_00;
  _Alloc_hider msg;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  ostringstream cmCPackLog_msg;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar2 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_IFW_PACKAGE_NAME","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 == (char *)0x0) {
    local_1a8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_PACKAGE_NAME","");
    pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    pcVar8 = (char *)(this->Name)._M_string_length;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = "Your package";
    }
    else {
      strlen(pcVar6);
    }
  }
  else {
    pcVar8 = (char *)(this->Name)._M_string_length;
    strlen(pcVar6);
  }
  std::__cxx11::string::_M_replace((ulong)&this->Name,0,pcVar8,(ulong)pcVar6);
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_IFW_PACKAGE_TITLE","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 == (char *)0x0) {
    local_1a8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_PACKAGE_DESCRIPTION_SUMMARY","");
    pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    pcVar8 = (char *)(this->Title)._M_string_length;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = "Your package description";
    }
    else {
      strlen(pcVar6);
    }
  }
  else {
    pcVar8 = (char *)(this->Title)._M_string_length;
    strlen(pcVar6);
  }
  std::__cxx11::string::_M_replace((ulong)&this->Title,0,pcVar8,(ulong)pcVar6);
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_PACKAGE_VERSION","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pcVar8 = (char *)(this->Version)._M_string_length;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = "1.0.0";
  }
  else {
    strlen(pcVar6);
  }
  std::__cxx11::string::_M_replace((ulong)&this->Version,0,pcVar8,(ulong)pcVar6);
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_PACKAGE_PUBLISHER","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 == (char *)0x0) {
    local_1a8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_PACKAGE_VENDOR","");
    pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (pcVar6 != (char *)0x0) goto LAB_00296b35;
  }
  else {
LAB_00296b35:
    pcVar8 = (char *)(this->Publisher)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&this->Publisher,0,pcVar8,(ulong)pcVar6);
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_IFW_PRODUCT_URL","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    pcVar8 = (char *)(this->ProductUrl)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&this->ProductUrl,0,pcVar8,(ulong)pcVar6);
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_IFW_PACKAGE_ICON","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    bVar4 = cmsys::SystemTools::FileExists(pcVar6);
    if (bVar4) {
      pcVar8 = (char *)(this->InstallerApplicationIcon)._M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace
                ((ulong)&this->InstallerApplicationIcon,0,pcVar8,(ulong)pcVar6);
    }
    else {
      local_1a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CPACK_IFW_PACKAGE_ICON","");
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      sVar7 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar6,pcVar6 + sVar7);
      printSkippedOptionWarning(this,(string *)local_1a8,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_PACKAGE_WINDOW_ICON","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    bVar4 = cmsys::SystemTools::FileExists(pcVar6);
    if (bVar4) {
      pcVar8 = (char *)(this->InstallerWindowIcon)._M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)&this->InstallerWindowIcon,0,pcVar8,(ulong)pcVar6);
    }
    else {
      local_1a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CPACK_IFW_PACKAGE_WINDOW_ICON","");
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      sVar7 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar6,pcVar6 + sVar7);
      printSkippedOptionWarning(this,(string *)local_1a8,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_IFW_PACKAGE_LOGO","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    bVar4 = cmsys::SystemTools::FileExists(pcVar6);
    if (bVar4) {
      pcVar8 = (char *)(this->Logo)._M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)&this->Logo,0,pcVar8,(ulong)pcVar6);
    }
    else {
      local_1a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CPACK_IFW_PACKAGE_LOGO","");
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      sVar7 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar6,pcVar6 + sVar7);
      printSkippedOptionWarning(this,(string *)local_1a8,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_PACKAGE_WATERMARK","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    bVar4 = cmsys::SystemTools::FileExists(pcVar6);
    if (bVar4) {
      pcVar8 = (char *)(this->Watermark)._M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)&this->Watermark,0,pcVar8,(ulong)pcVar6);
    }
    else {
      local_1a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CPACK_IFW_PACKAGE_WATERMARK","");
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      sVar7 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar6,pcVar6 + sVar7);
      printSkippedOptionWarning(this,(string *)local_1a8,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_IFW_PACKAGE_BANNER","")
  ;
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    bVar4 = cmsys::SystemTools::FileExists(pcVar6);
    if (bVar4) {
      pcVar8 = (char *)(this->Banner)._M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)&this->Banner,0,pcVar8,(ulong)pcVar6);
    }
    else {
      local_1a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CPACK_IFW_PACKAGE_BANNER","");
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      sVar7 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar6,pcVar6 + sVar7);
      printSkippedOptionWarning(this,(string *)local_1a8,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_PACKAGE_BACKGROUND","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    bVar4 = cmsys::SystemTools::FileExists(pcVar6);
    if (bVar4) {
      pcVar8 = (char *)(this->Background)._M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)&this->Background,0,pcVar8,(ulong)pcVar6);
    }
    else {
      local_1a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CPACK_IFW_PACKAGE_BACKGROUND","");
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      sVar7 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar6,pcVar6 + sVar7);
      printSkippedOptionWarning(this,(string *)local_1a8,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_PACKAGE_WIZARD_STYLE","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    psVar1 = &this->WizardStyle;
    pcVar8 = (char *)(this->WizardStyle)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar8,(ulong)pcVar6);
    iVar5 = std::__cxx11::string::compare((char *)psVar1);
    if ((((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0)) &&
        (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0)) &&
       (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Option CPACK_IFW_PACKAGE_WIZARD_STYLE has unknown value \"",
                 0x39);
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\". Expected values are: Modern, Aero, Mac, Classic.",0x33);
      std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
      std::ostream::put((char)local_1a8);
      std::ostream::flush();
      pcVar3 = (this->super_cmCPackIFWCommon).Generator;
      if (pcVar3 != (cmCPackIFWGenerator *)0x0) {
        this_00 = (pcVar3->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        msg._M_p = local_1c8._M_dataplus._M_p;
        sVar7 = strlen(local_1c8._M_dataplus._M_p);
        cmCPackLog::Log(this_00,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWInstaller.cxx"
                        ,0x8e,msg._M_p,sVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_PACKAGE_WIZARD_DEFAULT_WIDTH","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    pcVar8 = (char *)(this->WizardDefaultWidth)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&this->WizardDefaultWidth,0,pcVar8,(ulong)pcVar6);
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_PACKAGE_WIZARD_DEFAULT_HEIGHT","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    pcVar8 = (char *)(this->WizardDefaultHeight)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&this->WizardDefaultHeight,0,pcVar8,(ulong)pcVar6);
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_PACKAGE_TITLE_COLOR","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    pcVar8 = (char *)(this->TitleColor)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&this->TitleColor,0,pcVar8,(ulong)pcVar6);
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_PACKAGE_START_MENU_DIRECTORY","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 == (char *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->StartMenuDir);
  }
  else {
    pcVar8 = (char *)(this->StartMenuDir)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&this->StartMenuDir,0,pcVar8,(ulong)pcVar6);
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_TARGET_DIRECTORY","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 == (char *)0x0) {
    local_1a8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_PACKAGE_INSTALL_DIRECTORY","");
    pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    pcVar8 = (char *)(this->TargetDir)._M_string_length;
    if (pcVar6 != (char *)0x0) {
      std::__cxx11::string::_M_replace((ulong)&this->TargetDir,0,pcVar8,0x5b7117);
      std::__cxx11::string::append((char *)&this->TargetDir);
      goto LAB_0029763c;
    }
    pcVar6 = "@RootDir@/usr/local";
  }
  else {
    pcVar8 = (char *)(this->TargetDir)._M_string_length;
    strlen(pcVar6);
  }
  std::__cxx11::string::_M_replace((ulong)&this->TargetDir,0,pcVar8,(ulong)pcVar6);
LAB_0029763c:
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_ADMIN_TARGET_DIRECTORY","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    pcVar8 = (char *)(this->AdminTargetDir)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&this->AdminTargetDir,0,pcVar8,(ulong)pcVar6);
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_NAME","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    pcVar8 = (char *)(this->MaintenanceToolName)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&this->MaintenanceToolName,0,pcVar8,(ulong)pcVar6);
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_INI_FILE","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    pcVar8 = (char *)(this->MaintenanceToolIniFile)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&this->MaintenanceToolIniFile,0,pcVar8,(ulong)pcVar6);
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    local_1a8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS","");
    bVar4 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (bVar4) {
      pcVar6 = "true";
    }
    else {
      pcVar6 = "false";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->AllowNonAsciiCharacters,0,
               (char *)(this->AllowNonAsciiCharacters)._M_string_length,(ulong)pcVar6);
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    local_1a8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH","");
    bVar4 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (bVar4) {
      pcVar6 = "true";
    }
    else {
      pcVar6 = "false";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->AllowSpaceInPath,0,(char *)(this->AllowSpaceInPath)._M_string_length,
               (ulong)pcVar6);
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_PACKAGE_CONTROL_SCRIPT","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    pcVar8 = (char *)(this->ControlScript)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&this->ControlScript,0,pcVar8,(ulong)pcVar6);
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_IFW_PACKAGE_RESOURCES","");
  pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->Resources,
                      (this->Resources).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    local_1a8._0_8_ = pcVar2;
    sVar7 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar6,pcVar6 + sVar7);
    cmSystemTools::ExpandListArgument((string *)local_1a8,&this->Resources,false);
    if ((pointer)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  return;
}

Assistant:

void cmCPackIFWInstaller::ConfigureFromOptions()
{
  // Name;
  if (const char* optIFW_PACKAGE_NAME =
        this->GetOption("CPACK_IFW_PACKAGE_NAME")) {
    this->Name = optIFW_PACKAGE_NAME;
  } else if (const char* optPACKAGE_NAME =
               this->GetOption("CPACK_PACKAGE_NAME")) {
    this->Name = optPACKAGE_NAME;
  } else {
    this->Name = "Your package";
  }

  // Title;
  if (const char* optIFW_PACKAGE_TITLE =
        this->GetOption("CPACK_IFW_PACKAGE_TITLE")) {
    this->Title = optIFW_PACKAGE_TITLE;
  } else if (const char* optPACKAGE_DESCRIPTION_SUMMARY =
               this->GetOption("CPACK_PACKAGE_DESCRIPTION_SUMMARY")) {
    this->Title = optPACKAGE_DESCRIPTION_SUMMARY;
  } else {
    this->Title = "Your package description";
  }

  // Version;
  if (const char* option = this->GetOption("CPACK_PACKAGE_VERSION")) {
    this->Version = option;
  } else {
    this->Version = "1.0.0";
  }

  // Publisher
  if (const char* optIFW_PACKAGE_PUBLISHER =
        this->GetOption("CPACK_IFW_PACKAGE_PUBLISHER")) {
    this->Publisher = optIFW_PACKAGE_PUBLISHER;
  } else if (const char* optPACKAGE_VENDOR =
               GetOption("CPACK_PACKAGE_VENDOR")) {
    this->Publisher = optPACKAGE_VENDOR;
  }

  // ProductUrl
  if (const char* option = this->GetOption("CPACK_IFW_PRODUCT_URL")) {
    this->ProductUrl = option;
  }

  // ApplicationIcon
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_ICON")) {
    if (cmSystemTools::FileExists(option)) {
      this->InstallerApplicationIcon = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_ICON", option);
    }
  }

  // WindowIcon
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_WINDOW_ICON")) {
    if (cmSystemTools::FileExists(option)) {
      this->InstallerWindowIcon = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_WINDOW_ICON", option);
    }
  }

  // Logo
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_LOGO")) {
    if (cmSystemTools::FileExists(option)) {
      this->Logo = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_LOGO", option);
    }
  }

  // Watermark
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_WATERMARK")) {
    if (cmSystemTools::FileExists(option)) {
      this->Watermark = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_WATERMARK", option);
    }
  }

  // Banner
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_BANNER")) {
    if (cmSystemTools::FileExists(option)) {
      this->Banner = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_BANNER", option);
    }
  }

  // Background
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_BACKGROUND")) {
    if (cmSystemTools::FileExists(option)) {
      this->Background = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_BACKGROUND", option);
    }
  }

  // WizardStyle
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_WIZARD_STYLE")) {
    // Setting the user value in any case
    this->WizardStyle = option;
    // Check known values
    if (this->WizardStyle != "Modern" && this->WizardStyle != "Aero" &&
        this->WizardStyle != "Mac" && this->WizardStyle != "Classic") {
      cmCPackIFWLogger(
        WARNING, "Option CPACK_IFW_PACKAGE_WIZARD_STYLE has unknown value \""
          << option << "\". Expected values are: Modern, Aero, Mac, Classic."
          << std::endl);
    }
  }

  // WizardDefaultWidth
  if (const char* option =
        this->GetOption("CPACK_IFW_PACKAGE_WIZARD_DEFAULT_WIDTH")) {
    this->WizardDefaultWidth = option;
  }

  // WizardDefaultHeight
  if (const char* option =
        this->GetOption("CPACK_IFW_PACKAGE_WIZARD_DEFAULT_HEIGHT")) {
    this->WizardDefaultHeight = option;
  }

  // TitleColor
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_TITLE_COLOR")) {
    this->TitleColor = option;
  }

  // Start menu
  if (const char* optIFW_START_MENU_DIR =
        this->GetOption("CPACK_IFW_PACKAGE_START_MENU_DIRECTORY")) {
    this->StartMenuDir = optIFW_START_MENU_DIR;
  } else {
    this->StartMenuDir = Name;
  }

  // Default target directory for installation
  if (const char* optIFW_TARGET_DIRECTORY =
        this->GetOption("CPACK_IFW_TARGET_DIRECTORY")) {
    this->TargetDir = optIFW_TARGET_DIRECTORY;
  } else if (const char* optPACKAGE_INSTALL_DIRECTORY =
               this->GetOption("CPACK_PACKAGE_INSTALL_DIRECTORY")) {
    this->TargetDir = "@ApplicationsDir@/";
    this->TargetDir += optPACKAGE_INSTALL_DIRECTORY;
  } else {
    this->TargetDir = "@RootDir@/usr/local";
  }

  // Default target directory for installation with administrator rights
  if (const char* option =
        this->GetOption("CPACK_IFW_ADMIN_TARGET_DIRECTORY")) {
    this->AdminTargetDir = option;
  }

  // Maintenance tool
  if (const char* optIFW_MAINTENANCE_TOOL =
        this->GetOption("CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_NAME")) {
    this->MaintenanceToolName = optIFW_MAINTENANCE_TOOL;
  }

  // Maintenance tool ini file
  if (const char* optIFW_MAINTENANCE_TOOL_INI =
        this->GetOption("CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_INI_FILE")) {
    this->MaintenanceToolIniFile = optIFW_MAINTENANCE_TOOL_INI;
  }

  // Allow non-ASCII characters
  if (this->GetOption("CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS")) {
    if (this->IsOn("CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS")) {
      this->AllowNonAsciiCharacters = "true";
    } else {
      this->AllowNonAsciiCharacters = "false";
    }
  }

  // Space in path
  if (this->GetOption("CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH")) {
    if (this->IsOn("CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH")) {
      this->AllowSpaceInPath = "true";
    } else {
      this->AllowSpaceInPath = "false";
    }
  }

  // Control script
  if (const char* optIFW_CONTROL_SCRIPT =
        this->GetOption("CPACK_IFW_PACKAGE_CONTROL_SCRIPT")) {
    this->ControlScript = optIFW_CONTROL_SCRIPT;
  }

  // Resources
  if (const char* optIFW_PACKAGE_RESOURCES =
        this->GetOption("CPACK_IFW_PACKAGE_RESOURCES")) {
    this->Resources.clear();
    cmSystemTools::ExpandListArgument(optIFW_PACKAGE_RESOURCES,
                                      this->Resources);
  }
}